

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

cbtBroadphaseProxy * __thiscall
cbtAxisSweep3Internal<unsigned_short>::createProxy
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtVector3 *aabbMin,cbtVector3 *aabbMax,
          int shapeType,void *userPtr,int collisionFilterGroup,int collisionFilterMask,
          cbtDispatcher *dispatcher)

{
  cbtDbvtBroadphase *pcVar1;
  Handle *pHVar2;
  unsigned_short uVar3;
  int iVar4;
  undefined4 extraout_var;
  
  uVar3 = addHandle(this,aabbMin,aabbMax,userPtr,collisionFilterGroup,collisionFilterMask,dispatcher
                   );
  pcVar1 = this->m_raycastAccelerator;
  pHVar2 = this->m_pHandles;
  if (pcVar1 != (cbtDbvtBroadphase *)0x0) {
    iVar4 = (*(pcVar1->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface[2])
                      (pcVar1,aabbMin,aabbMax,(ulong)(uint)shapeType,userPtr,collisionFilterGroup,
                       (ulong)(uint)collisionFilterMask,dispatcher);
    pHVar2[uVar3].m_dbvtProxy = (cbtBroadphaseProxy *)CONCAT44(extraout_var,iVar4);
  }
  return &pHVar2[uVar3].super_cbtBroadphaseProxy;
}

Assistant:

cbtBroadphaseProxy* cbtAxisSweep3Internal<BP_FP_INT_TYPE>::createProxy(const cbtVector3& aabbMin, const cbtVector3& aabbMax, int shapeType, void* userPtr, int collisionFilterGroup, int collisionFilterMask, cbtDispatcher* dispatcher)
{
	(void)shapeType;
	BP_FP_INT_TYPE handleId = addHandle(aabbMin, aabbMax, userPtr, collisionFilterGroup, collisionFilterMask, dispatcher);

	Handle* handle = getHandle(handleId);

	if (m_raycastAccelerator)
	{
		cbtBroadphaseProxy* rayProxy = m_raycastAccelerator->createProxy(aabbMin, aabbMax, shapeType, userPtr, collisionFilterGroup, collisionFilterMask, dispatcher);
		handle->m_dbvtProxy = rayProxy;
	}
	return handle;
}